

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindLibraryCommand.cxx
# Opt level: O1

void __thiscall
cmFindLibraryCommand::AddArchitecturePath
          (cmFindLibraryCommand *this,string *dir,size_type start_pos,char *suffix,bool fresh)

{
  pointer pcVar1;
  char *pcVar2;
  cmFindLibraryCommand *pcVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  long lVar7;
  size_t sVar8;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  string libX;
  string msg;
  string lib;
  string local_128;
  char *local_108;
  string local_100;
  cmFindLibraryCommand *local_e0;
  string local_d8;
  pointer local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  char *local_a0;
  undefined8 local_98;
  size_type local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  undefined8 local_80;
  undefined8 local_78;
  char *local_70;
  undefined8 local_68;
  size_t local_60;
  char *local_58;
  undefined8 local_50;
  undefined8 local_48;
  char *local_40;
  undefined8 local_38;
  
  local_108 = suffix;
  local_e0 = this;
  lVar7 = std::__cxx11::string::find((char *)dir,0x8139a5,start_pos);
  if (lVar7 != -1) {
    std::__cxx11::string::substr((ulong)&local_d8,(ulong)dir);
    bVar4 = cmsys::SystemTools::FileIsDirectory(&local_d8);
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_128,local_d8._M_dataplus._M_p,
               (char *)(local_d8._M_string_length + (long)local_d8._M_dataplus._M_p));
    std::__cxx11::string::append((char *)&local_128);
    bVar5 = cmsys::SystemTools::FileIsDirectory(&local_128);
    if (bVar4 && bVar5) {
      bVar6 = cmLibDirsLinked(&local_128,&local_d8);
      bVar5 = bVar5 && !bVar6;
    }
    if (bVar5 != false) {
      std::__cxx11::string::substr((ulong)&local_100,(ulong)dir);
      std::__cxx11::string::_M_append((char *)&local_128,(ulong)local_100._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
      }
      pcVar2 = local_108;
      sVar8 = strlen(local_108);
      AddArchitecturePath(local_e0,&local_128,lVar7 + sVar8 + 4,pcVar2,true);
    }
    if (bVar4) {
      AddArchitecturePath(local_e0,dir,lVar7 + 4,local_108,false);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
  }
  if (fresh) {
    bVar4 = cmsys::SystemTools::FileIsDirectory(dir);
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    pcVar1 = (dir->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_128,pcVar1,pcVar1 + dir->_M_string_length);
    std::__cxx11::string::append((char *)&local_128);
    bVar5 = cmsys::SystemTools::FileIsDirectory(&local_128);
    pcVar3 = local_e0;
    if (bVar4 && bVar5) {
      bVar6 = cmLibDirsLinked(&local_128,dir);
      bVar5 = bVar5 && !bVar6;
    }
    if (bVar5 != false) {
      std::__cxx11::string::append((char *)&local_128);
      pcVar2 = local_108;
      if ((pcVar3->super_cmFindBase).super_cmFindCommon.DebugMode == true) {
        local_d8._M_dataplus._M_p = (pointer)0xd;
        local_d8._M_string_length = 0x7c9c3e;
        local_d8.field_2._M_allocated_capacity = 0;
        local_b8 = (pcVar3->super_cmFindBase).VariableName._M_dataplus._M_p;
        local_d8.field_2._8_8_ = (pcVar3->super_cmFindBase).VariableName._M_string_length;
        local_b0 = 0;
        local_a8 = 0x19;
        local_a0 = ") added replacement path ";
        local_98 = 0;
        local_90 = local_128._M_string_length;
        local_88 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_128._M_dataplus._M_p;
        local_80 = 0;
        local_78 = 0x2b;
        local_70 = " to PATH_SUFFIXES for architecture suffix \'";
        local_68 = 0;
        local_60 = strlen(local_108);
        local_58 = pcVar2;
        local_50 = 0;
        local_48 = 1;
        local_40 = "\'";
        local_38 = 0;
        views._M_len = 7;
        views._M_array = (iterator)&local_d8;
        cmCatViews(&local_100,views);
        cmFindCommon::DebugMessage(&(pcVar3->super_cmFindBase).super_cmFindCommon,&local_100);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p != &local_100.field_2) {
          operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
        }
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &(pcVar3->super_cmFindBase).super_cmFindCommon.SearchPaths,&local_128);
    }
    if (bVar4) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&(pcVar3->super_cmFindBase).super_cmFindCommon.SearchPaths,dir);
      pcVar2 = local_108;
      if ((pcVar3->super_cmFindBase).super_cmFindCommon.DebugMode == true) {
        local_d8._M_dataplus._M_p = (pointer)0xd;
        local_d8._M_string_length = 0x7c9c3e;
        local_d8.field_2._M_allocated_capacity = 0;
        local_b8 = (pcVar3->super_cmFindBase).VariableName._M_dataplus._M_p;
        local_d8.field_2._8_8_ = (pcVar3->super_cmFindBase).VariableName._M_string_length;
        local_b0 = 0;
        local_a8 = 0x19;
        local_a0 = ") added replacement path ";
        local_98 = 0;
        local_88 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(dir->_M_dataplus)._M_p;
        local_90 = dir->_M_string_length;
        local_80 = 0;
        local_78 = 0x2b;
        local_70 = " to PATH_SUFFIXES for architecture suffix \'";
        local_68 = 0;
        local_60 = strlen(local_108);
        local_58 = pcVar2;
        local_50 = 0;
        local_48 = 1;
        local_40 = "\'";
        local_38 = 0;
        views_00._M_len = 7;
        views_00._M_array = (iterator)&local_d8;
        cmCatViews(&local_100,views_00);
        cmFindCommon::DebugMessage(&(pcVar3->super_cmFindBase).super_cmFindCommon,&local_100);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p != &local_100.field_2) {
          operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void cmFindLibraryCommand::AddArchitecturePath(
  std::string const& dir, std::string::size_type start_pos, const char* suffix,
  bool fresh)
{
  std::string::size_type pos = dir.find("lib/", start_pos);

  if (pos != std::string::npos) {
    // Check for "lib".
    std::string lib = dir.substr(0, pos + 3);
    bool use_lib = cmSystemTools::FileIsDirectory(lib);

    // Check for "lib<suffix>" and use it first.
    std::string libX = lib + suffix;
    bool use_libX = cmSystemTools::FileIsDirectory(libX);

    // Avoid copies of the same directory due to symlinks.
    if (use_libX && use_lib && cmLibDirsLinked(libX, lib)) {
      use_libX = false;
    }

    if (use_libX) {
      libX += dir.substr(pos + 3);
      std::string::size_type libX_pos = pos + 3 + strlen(suffix) + 1;
      this->AddArchitecturePath(libX, libX_pos, suffix);
    }

    if (use_lib) {
      this->AddArchitecturePath(dir, pos + 3 + 1, suffix, false);
    }
  }

  if (fresh) {
    // Check for the original unchanged path.
    bool use_dir = cmSystemTools::FileIsDirectory(dir);

    // Check for <dir><suffix>/ and use it first.
    std::string dirX = dir + suffix;
    bool use_dirX = cmSystemTools::FileIsDirectory(dirX);

    // Avoid copies of the same directory due to symlinks.
    if (use_dirX && use_dir && cmLibDirsLinked(dirX, dir)) {
      use_dirX = false;
    }

    if (use_dirX) {
      dirX += "/";
      if (this->DebugMode) {
        std::string msg = cmStrCat(
          "find_library(", this->VariableName, ") added replacement path ",
          dirX, " to PATH_SUFFIXES for architecture suffix '", suffix, "'");
        this->DebugMessage(msg);
      }
      this->SearchPaths.push_back(std::move(dirX));
    }

    if (use_dir) {
      this->SearchPaths.push_back(dir);
      if (this->DebugMode) {
        std::string msg = cmStrCat(
          "find_library(", this->VariableName, ") added replacement path ",
          dir, " to PATH_SUFFIXES for architecture suffix '", suffix, "'");
        this->DebugMessage(msg);
      }
    }
  }
}